

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ParseExtensions
          (Parser *this,DescriptorProto *message,LocationRecorder *extensions_location)

{
  int iVar1;
  void **ppvVar2;
  Tokenizer *pTVar3;
  DescriptorProto *pDVar4;
  bool bVar5;
  DescriptorProto_ExtensionRange *descriptor;
  int iVar6;
  int32 iVar7;
  int32 iVar8;
  int start;
  LocationRecorder start_location;
  Token start_token;
  LocationRecorder location;
  int local_a8;
  int32 local_a4;
  LocationRecorder *local_a0;
  LocationRecorder local_98;
  undefined1 local_88 [8];
  _Alloc_hider local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  undefined8 local_60;
  int local_58;
  RepeatedPtrFieldBase *local_50;
  DescriptorProto *local_48;
  LocationRecorder local_40;
  
  local_a0 = extensions_location;
  bVar5 = Consume(this,"extensions");
  if (bVar5) {
    local_50 = &(message->extension_range_).super_RepeatedPtrFieldBase;
    local_48 = message;
    do {
      pDVar4 = local_48;
      iVar1 = (local_48->extension_range_).super_RepeatedPtrFieldBase.current_size_;
      LocationRecorder::Init(&local_40,local_a0);
      LocationRecorder::AddPath(&local_40,iVar1);
      iVar1 = (pDVar4->extension_range_).super_RepeatedPtrFieldBase.current_size_;
      iVar6 = (pDVar4->extension_range_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar1 < iVar6) {
        ppvVar2 = (pDVar4->extension_range_).super_RepeatedPtrFieldBase.elements_;
        (pDVar4->extension_range_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        descriptor = (DescriptorProto_ExtensionRange *)ppvVar2[iVar1];
      }
      else {
        if (iVar6 == (pDVar4->extension_range_).super_RepeatedPtrFieldBase.total_size_) {
          internal::RepeatedPtrFieldBase::Reserve(local_50,iVar6 + 1);
          iVar6 = (pDVar4->extension_range_).super_RepeatedPtrFieldBase.allocated_size_;
        }
        (pDVar4->extension_range_).super_RepeatedPtrFieldBase.allocated_size_ = iVar6 + 1;
        descriptor = internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>
                     ::New();
        ppvVar2 = (pDVar4->extension_range_).super_RepeatedPtrFieldBase.elements_;
        iVar1 = (pDVar4->extension_range_).super_RepeatedPtrFieldBase.current_size_;
        (pDVar4->extension_range_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        ppvVar2[iVar1] = descriptor;
      }
      LocationRecorder::RecordLegacyLocation(&local_40,&descriptor->super_Message,NUMBER);
      local_78 = 0;
      local_70._M_local_buf[0] = '\0';
      local_80._M_p = (pointer)&local_70;
      LocationRecorder::Init(&local_98,&local_40);
      LocationRecorder::AddPath(&local_98,1);
      pTVar3 = this->input_;
      local_88._0_4_ = (pTVar3->current_).type;
      std::__cxx11::string::_M_assign((string *)&local_80);
      local_58 = (pTVar3->current_).end_column;
      local_60._0_4_ = (pTVar3->current_).line;
      local_60._4_4_ = (pTVar3->current_).column;
      bVar5 = ConsumeInteger(this,&local_a4,"Expected field number range.");
      LocationRecorder::~LocationRecorder(&local_98);
      if (bVar5) {
        bVar5 = TryConsume(this,"to");
        if (bVar5) {
          LocationRecorder::Init(&local_98,&local_40);
          LocationRecorder::AddPath(&local_98,2);
          bVar5 = TryConsume(this,"max");
          iVar8 = -2;
          if ((!bVar5) &&
             (bVar5 = ConsumeInteger(this,&local_a8,"Expected integer."), iVar8 = local_a8, !bVar5))
          {
            LocationRecorder::~LocationRecorder(&local_98);
            goto LAB_00216f3f;
          }
          LocationRecorder::~LocationRecorder(&local_98);
          iVar7 = local_a4;
        }
        else {
          LocationRecorder::Init(&local_98,&local_40);
          LocationRecorder::AddPath(&local_98,2);
          LocationRecorder::StartAt(&local_98,(Token *)local_88);
          LocationRecorder::EndAt(&local_98,(Token *)local_88);
          iVar8 = local_a4;
          LocationRecorder::~LocationRecorder(&local_98);
          iVar7 = iVar8;
        }
        local_a8 = iVar8 + 1;
        descriptor->start_ = iVar7;
        *(byte *)descriptor->_has_bits_ = (byte)descriptor->_has_bits_[0] | 3;
        descriptor->end_ = local_a8;
        bVar5 = true;
      }
      else {
LAB_00216f3f:
        bVar5 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_p != &local_70) {
        operator_delete(local_80._M_p,
                        CONCAT71(local_70._M_allocated_capacity._1_7_,local_70._M_local_buf[0]) + 1)
        ;
      }
      LocationRecorder::~LocationRecorder(&local_40);
      if (!bVar5) goto LAB_00216fa4;
      bVar5 = TryConsume(this,",");
    } while (bVar5);
    bVar5 = ConsumeEndOfDeclaration(this,";",local_a0);
  }
  else {
LAB_00216fa4:
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool Parser::ParseExtensions(DescriptorProto* message,
                             const LocationRecorder& extensions_location) {
  // Parse the declaration.
  DO(Consume("extensions"));

  do {
    // Note that kExtensionRangeFieldNumber was already pushed by the parent.
    LocationRecorder location(extensions_location,
                              message->extension_range_size());

    DescriptorProto::ExtensionRange* range = message->add_extension_range();
    location.RecordLegacyLocation(
        range, DescriptorPool::ErrorCollector::NUMBER);

    int start, end;
    io::Tokenizer::Token start_token;

    {
      LocationRecorder start_location(
          location, DescriptorProto::ExtensionRange::kStartFieldNumber);
      start_token = input_->current();
      DO(ConsumeInteger(&start, "Expected field number range."));
    }

    if (TryConsume("to")) {
      LocationRecorder end_location(
          location, DescriptorProto::ExtensionRange::kEndFieldNumber);
      if (TryConsume("max")) {
        // Set to the sentinel value - 1 since we increment the value below.
        // The actual value of the end of the range should be set with
        // AdjustExtensionRangesWithMaxEndNumber.
        end = kMaxExtensionRangeSentinel - 1;
      } else {
        DO(ConsumeInteger(&end, "Expected integer."));
      }
    } else {
      LocationRecorder end_location(
          location, DescriptorProto::ExtensionRange::kEndFieldNumber);
      end_location.StartAt(start_token);
      end_location.EndAt(start_token);
      end = start;
    }

    // Users like to specify inclusive ranges, but in code we like the end
    // number to be exclusive.
    ++end;

    range->set_start(start);
    range->set_end(end);
  } while (TryConsume(","));

  DO(ConsumeEndOfDeclaration(";", &extensions_location));
  return true;
}